

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_0::Texture2DLodControlTestInstance::Texture2DLodControlTestInstance
          (Texture2DLodControlTestInstance *this,Context *context,
          Texture2DMipmapTestCaseParameters *testParameters)

{
  int a;
  TestTexture2D *pTVar1;
  RGBA local_a4;
  Vec4 local_a0;
  PixelBufferAccess local_90;
  uint local_68;
  uint local_64;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  SharedPtr<vkt::pipeline::TestTexture2D> local_48;
  int local_34;
  undefined4 local_30;
  int numLevels;
  VkFormat format;
  Texture2DMipmapTestCaseParameters *local_20;
  Texture2DMipmapTestCaseParameters *testParameters_local;
  Context *context_local;
  Texture2DLodControlTestInstance *this_local;
  
  local_20 = testParameters;
  testParameters_local = (Texture2DMipmapTestCaseParameters *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture2DLodControlTestInstance_016b4888;
  this->m_texWidth = 0x40;
  this->m_texHeight = 0x40;
  Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
            (&this->m_testParameters,local_20);
  this->m_minFilter =
       (local_20->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.minFilter
  ;
  de::SharedPtr<vkt::pipeline::TestTexture2D>::SharedPtr(&this->m_texture,(TestTexture2D *)0x0);
  util::TextureRenderer::TextureRenderer
            (&this->m_renderer,(Context *)testParameters_local,
             (local_20->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
             sampleCount,this->m_texWidth << 2,this->m_texHeight << 2);
  local_30 = 0x25;
  a = de::max<int>(this->m_texWidth,this->m_texHeight);
  local_34 = deLog2Floor32(a);
  local_34 = local_34 + 1;
  pTVar1 = (TestTexture2D *)operator_new(0x70);
  _step = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  vkt::pipeline::TestTexture2D::TestTexture2D
            (pTVar1,(TextureFormat *)&step,this->m_texWidth,this->m_texHeight);
  de::SharedPtr<vkt::pipeline::TestTexture2D>::SharedPtr(&local_48,pTVar1);
  de::SharedPtr<vkt::pipeline::TestTexture2D>::operator=(&this->m_texture,&local_48);
  de::SharedPtr<vkt::pipeline::TestTexture2D>::~SharedPtr(&local_48);
  for (inc = 0; (int)inc < local_34; inc = inc + 1) {
    dec = (deUint32)(0xff / (long)(local_34 + -1));
    rgb = deClamp32(dec * inc,0,0xff);
    color = 0xff - rgb;
    local_68 = rgb << 0x10 | color * 0x100;
    local_64 = local_68 | 0xff;
    local_68 = local_68 | 0xff0000ff;
    pTVar1 = de::SharedPtr<vkt::pipeline::TestTexture2D>::operator->(&this->m_texture);
    (*(pTVar1->super_TestTexture)._vptr_TestTexture[7])(&local_90,pTVar1,(ulong)inc,0);
    tcu::RGBA::RGBA(&local_a4,local_68);
    tcu::RGBA::toVec((RGBA *)&local_a0);
    tcu::clear(&local_90,&local_a0);
  }
  util::TextureRenderer::add2DTexture(&this->m_renderer,&this->m_texture);
  return;
}

Assistant:

Texture2DLodControlTestInstance::Texture2DLodControlTestInstance (Context& context, const Texture2DMipmapTestCaseParameters& testParameters)
	: TestInstance		(context)
	, m_texWidth		(64) //64
	, m_texHeight		(64)//64
	, m_testParameters	(testParameters)
	, m_minFilter		(testParameters.minFilter)
	, m_texture			(DE_NULL)
	, m_renderer		(context, testParameters.sampleCount, m_texWidth*4, m_texHeight*4)
{
	const VkFormat	format		= VK_FORMAT_R8G8B8A8_UNORM;
	const int		numLevels	= deLog2Floor32(de::max(m_texWidth, m_texHeight))+1;

	m_texture = TestTexture2DSp(new pipeline::TestTexture2D(vk::mapVkFormat(format), m_texWidth, m_texHeight));

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const deUint32	step	= 0xff / (numLevels-1);
		const deUint32	inc		= deClamp32(step*levelNdx, 0x00, 0xff);
		const deUint32	dec		= 0xff - inc;
		const deUint32	rgb		= (inc << 16) | (dec << 8) | 0xff;
		const deUint32	color	= 0xff000000 | rgb;

		tcu::clear(m_texture->getLevel(levelNdx, 0), tcu::RGBA(color).toVec());
	}

	m_renderer.add2DTexture(m_texture);
}